

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O0

GLFWglproc getProcAddressEGL(char *procname)

{
  void *pvVar1;
  GLFWglproc proc;
  _GLFWwindow *window;
  char *procname_local;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (pvVar1 != (void *)0x0) {
    if ((*(long *)((long)pvVar1 + 0x2a0) == 0) ||
       (procname_local =
             (char *)_glfwPlatformGetModuleSymbol(*(void **)((long)pvVar1 + 0x2a0),procname),
       (GLFWproc)procname_local == (GLFWproc)0x0)) {
      procname_local = (char *)(*_glfw.egl.GetProcAddress)(procname);
    }
    return (GLFWglproc)procname_local;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/egl_context.c"
                ,0x138,"GLFWglproc getProcAddressEGL(const char *)");
}

Assistant:

static GLFWglproc getProcAddressEGL(const char* procname)
{
    _GLFWwindow* window = _glfwPlatformGetTls(&_glfw.contextSlot);
    assert(window != NULL);

    if (window->context.egl.client)
    {
        GLFWglproc proc = (GLFWglproc)
            _glfwPlatformGetModuleSymbol(window->context.egl.client, procname);
        if (proc)
            return proc;
    }

    return eglGetProcAddress(procname);
}